

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

int lj_opt_fwd_wasnonnil(jit_State *J,IROpT loadop,IRRef xref)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  IRIns *pIVar5;
  IRRef1 *pIVar6;
  IRIns *pIVar7;
  undefined2 in_register_00000032;
  
  pIVar6 = J->chain + (ulong)CONCAT22(in_register_00000032,loadop) + 7;
  while (xref < *pIVar6) {
    pIVar5 = (J->cur).ir;
    pIVar7 = pIVar5 + *pIVar6;
    if ((pIVar7->field_0).op1 == xref) goto LAB_00147b93;
    if (((pIVar7->field_1).t.irt & 0x1f) == 0) {
      uVar3 = *(ushort *)((long)pIVar5 + (ulong)(pIVar7->field_0).op1 * 8 + 2);
      uVar4 = *(ushort *)((long)pIVar5 + (ulong)xref * 8 + 2);
      if (loadop != 0x41) {
        bVar1 = *(byte *)((long)pIVar5 + (ulong)uVar3 * 8 + 4);
        bVar2 = *(byte *)((long)pIVar5 + (ulong)uVar4 * 8 + 4);
        if (((bVar2 ^ bVar1) & 0x1f) != 0) {
          if (((bVar1 & 0x1f) == 5) == ((bVar2 & 0x1f) != 5)) {
            return 0;
          }
          goto LAB_00147b6d;
        }
      }
      if (uVar3 == uVar4) {
        return 0;
      }
      if ((short)(uVar3 | uVar4) < 0) {
        return 0;
      }
    }
LAB_00147b6d:
    pIVar6 = &(pIVar7->field_0).prev;
  }
  pIVar6 = J->chain + CONCAT22(in_register_00000032,loadop);
  while( true ) {
    if (*pIVar6 <= xref) {
      return 0;
    }
    pIVar7 = (J->cur).ir + *pIVar6;
    if ((pIVar7->field_0).op1 == xref) break;
    pIVar6 = &(pIVar7->field_0).prev;
  }
LAB_00147b93:
  return (uint)(((pIVar7->field_1).t.irt & 0x1f) != 0);
}

Assistant:

int lj_opt_fwd_wasnonnil(jit_State *J, IROpT loadop, IRRef xref)
{
  /* First check stores. */
  IRRef ref = J->chain[loadop+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    if (store->op1 == xref) {  /* Same xREF. */
      /* A nil store MAY alias, but a non-nil store MUST alias. */
      return !irt_isnil(store->t);
    } else if (irt_isnil(store->t)) {  /* Must check any nil store. */
      IRRef skref = IR(store->op1)->op2;
      IRRef xkref = IR(xref)->op2;
      /* Same key type MAY alias. Need ALOAD check due to multiple int types. */
      if (loadop == IR_ALOAD || irt_sametype(IR(skref)->t, IR(xkref)->t)) {
	if (skref == xkref || !irref_isk(skref) || !irref_isk(xkref))
	  return 0;  /* A nil store with same const key or var key MAY alias. */
	/* Different const keys CANNOT alias. */
      } else if (irt_isp32(IR(skref)->t) != irt_isp32(IR(xkref)->t)) {
	return 0;  /* HREF and HREFK MAY alias. */
      }  /* Different key types CANNOT alias. */
    }  /* Other non-nil stores MAY alias. */
    ref = store->prev;
  }

  /* Check loads since nothing could be derived from stores. */
  ref = J->chain[loadop];
  while (ref > xref) {
    IRIns *load = IR(ref);
    if (load->op1 == xref) {  /* Same xREF. */
      /* A nil load MAY alias, but a non-nil load MUST alias. */
      return !irt_isnil(load->t);
    }  /* Other non-nil loads MAY alias. */
    ref = load->prev;
  }
  return 0;  /* Nothing derived at all, previous value MAY be nil. */
}